

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O2

bool __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>::
IsObjTypeSpecEquivalent
          (SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false> *this,
          Type *type,TypeEquivalenceRecord *record,uint *failedPropertyIndex)

{
  uint uVar1;
  bool bVar2;
  uint pi;
  ulong uVar3;
  EquivalentPropertyEntry *entry;
  
  uVar1 = record->propertyCount;
  entry = record->properties;
  uVar3 = 0;
  do {
    if (uVar1 == uVar3) {
LAB_00c666b9:
      return uVar1 <= uVar3;
    }
    bVar2 = IsObjTypeSpecEquivalentImpl<false>(this,type,entry);
    if (!bVar2) {
      *failedPropertyIndex = (uint)uVar3;
      goto LAB_00c666b9;
    }
    uVar3 = uVar3 + 1;
    entry = entry + 1;
  } while( true );
}

Assistant:

bool SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::IsObjTypeSpecEquivalent(const Type* type, const TypeEquivalenceRecord& record, uint& failedPropertyIndex)
    {
        uint propertyCount = record.propertyCount;
        Js::EquivalentPropertyEntry* properties = record.properties;
        for (uint pi = 0; pi < propertyCount; pi++)
        {
            const EquivalentPropertyEntry* refInfo = &properties[pi];
            if (!this->IsObjTypeSpecEquivalentImpl<false>(type, refInfo))
            {
                failedPropertyIndex = pi;
                return false;
            }
        }

        return true;
    }